

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O3

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,SignParameter *sign_parameter)

{
  pointer puVar1;
  char *pcVar2;
  size_type __dnew;
  undefined1 local_78 [8];
  pointer puStack_70;
  _Alloc_hider local_68;
  uchar local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  Pubkey *local_38;
  
  cfd::core::ByteData::ByteData(&this->data_);
  cfd::core::Pubkey::Pubkey(&this->related_pubkey_);
  local_38 = &this->related_pubkey_;
  cfd::core::SigHashType::SigHashType(&this->sighash_type_);
  (this->op_code_)._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b0f30;
  (this->op_code_).data_type_ = kOpInvalidOpCode;
  local_40 = &(this->op_code_).text_data_.field_2;
  (this->op_code_).text_data_._M_dataplus._M_p = (pointer)local_40;
  local_78 = (undefined1  [8])0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)&(this->op_code_).text_data_,(ulong)local_78);
  (this->op_code_).text_data_._M_dataplus._M_p = pcVar2;
  (this->op_code_).text_data_.field_2._M_allocated_capacity = (size_type)local_78;
  builtin_strncpy(pcVar2,"OP_INVALIDOPCODE",0x10);
  (this->op_code_).text_data_._M_string_length = (size_type)local_78;
  (this->op_code_).text_data_._M_dataplus._M_p[(long)local_78] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)sign_parameter);
  puVar1 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_78;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_70;
  (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_68._M_p;
  local_78 = (undefined1  [8])0x0;
  puStack_70 = (pointer)0x0;
  local_68._M_p = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
  }
  this->data_type_ = sign_parameter->data_type_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &sign_parameter->related_pubkey_);
  puVar1 = (this->related_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->related_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_78;
  (this->related_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_70;
  (this->related_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_68._M_p;
  local_78 = (undefined1  [8])0x0;
  puStack_70 = (pointer)0x0;
  local_68._M_p = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
  }
  this->der_encode_ = sign_parameter->der_encode_;
  cfd::core::SigHashType::SigHashType((SigHashType *)local_78,&sign_parameter->sighash_type_);
  cfd::core::SigHashType::operator=(&this->sighash_type_,(SigHashType *)local_78);
  cfd::core::ScriptOperator::ScriptOperator((ScriptOperator *)local_78,&sign_parameter->op_code_);
  cfd::core::ScriptOperator::operator=(&this->op_code_,(ScriptOperator *)local_78);
  local_78 = (undefined1  [8])&PTR__ScriptOperator_002b0f30;
  if ((uchar *)local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  return;
}

Assistant:

SignParameter::SignParameter(const SignParameter& sign_parameter) {
  data_ = sign_parameter.GetData();
  data_type_ = sign_parameter.GetDataType();
  related_pubkey_ = sign_parameter.GetRelatedPubkey();
  der_encode_ = sign_parameter.IsDerEncode();
  sighash_type_ = sign_parameter.GetSigHashType();
  op_code_ = sign_parameter.GetOpCode();
}